

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O0

void __thiscall smf::MidiEventList::clear(MidiEventList *this)

{
  MidiEvent *this_00;
  size_type sVar1;
  reference ppMVar2;
  undefined4 local_14;
  int i;
  MidiEventList *this_local;
  
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::size(&this->list);
    if ((int)sVar1 <= local_14) break;
    ppMVar2 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::operator[]
                        (&this->list,(long)local_14);
    if (*ppMVar2 != (value_type)0x0) {
      ppMVar2 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::operator[]
                          (&this->list,(long)local_14);
      this_00 = *ppMVar2;
      if (this_00 != (MidiEvent *)0x0) {
        MidiEvent::~MidiEvent(this_00);
        operator_delete(this_00);
      }
      ppMVar2 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::operator[]
                          (&this->list,(long)local_14);
      *ppMVar2 = (value_type)0x0;
    }
    local_14 = local_14 + 1;
  }
  std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::resize(&this->list,0);
  return;
}

Assistant:

void MidiEventList::clear(void) {
	for (int i=0; i<(int)list.size(); i++) {
		if (list[i] != NULL) {
			delete list[i];
			list[i] = NULL;
		}
	}
	list.resize(0);
}